

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceDiffusion.cpp
# Opt level: O2

void __thiscall OpenMD::SurfaceDiffusion::positionCorrelation(SurfaceDiffusion *this)

{
  size_type __n;
  int *piVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  size_type sVar11;
  long lVar12;
  ulong uVar13;
  size_t i;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  reference rVar18;
  long local_c8;
  Vector3d jPos;
  Vector3d kPos;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&kPos.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&jPos.super_Vector<double,_3U>);
  pdVar2 = (this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  pdVar2 = (this->yHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->yHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->yHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  pdVar2 = (this->rHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->rHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->rHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  piVar3 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  pvVar4 = (this->positions2_).
           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar11 = (size_type)
           (int)(((long)*(pointer *)
                         ((long)&(pvVar4->
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 )._M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar4->
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           )._M_impl.super__Vector_impl_data) / 0x18);
  std::vector<double,_std::allocator<double>_>::resize(&this->xHist_,sVar11);
  std::vector<double,_std::allocator<double>_>::resize(&this->yHist_,sVar11);
  std::vector<double,_std::allocator<double>_>::resize(&this->rHist_,sVar11);
  std::vector<int,_std::allocator<int>_>::resize(&this->count_,sVar11);
  uVar13 = 0;
  while( true ) {
    pvVar4 = (this->positions2_).
             super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->positions2_).
                       super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <= uVar13)
    break;
    uVar9 = (int)(((long)*(pointer *)
                          ((long)&pvVar4[uVar13].
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                  *(long *)&pvVar4[uVar13].
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data) / 0x18) - 1;
    if ((int)uVar9 < 1) {
      uVar9 = 0;
    }
    local_c8 = 0;
    sVar11 = 0;
    while (sVar11 != uVar9) {
      __n = sVar11 + 1;
      rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((this->moBool2_).
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar13,__n);
      if ((*rVar18._M_p & rVar18._M_mask) != 0) {
        lVar8 = sVar11 * 0x18;
        lVar14 = 0;
        lVar12 = local_c8;
        while( true ) {
          pvVar4 = (this->positions2_).
                   super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)*(pointer *)
                              ((long)&(pvVar4->
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      )._M_impl.super__Vector_impl_data + 8) -
                      *(long *)&(pvVar4->
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                )._M_impl.super__Vector_impl_data) / 0x18) <= sVar11) break;
          Vector<double,_3U>::operator=
                    (&kPos.super_Vector<double,_3U>,
                     (Vector<double,_3U> *)
                     (*(long *)&pvVar4[uVar13].
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl + lVar12));
          Vector<double,_3U>::operator=
                    (&jPos.super_Vector<double,_3U>,
                     (Vector<double,_3U> *)
                     (*(long *)&(this->positions2_).
                                super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data + lVar8));
          dVar17 = kPos.super_Vector<double,_3U>.data_[0] - jPos.super_Vector<double,_3U>.data_[0];
          dVar15 = kPos.super_Vector<double,_3U>.data_[1] - jPos.super_Vector<double,_3U>.data_[1];
          operator-(&local_48,&kPos.super_Vector<double,_3U>,&jPos.super_Vector<double,_3U>);
          dVar16 = Vector<double,_3U>::lengthSquare(&local_48);
          pdVar2 = (this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar10 = lVar14 >> 0x1d;
          *(double *)((long)pdVar2 + lVar10) = dVar17 * dVar17 + *(double *)((long)pdVar2 + lVar10);
          pdVar2 = (this->yHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(double *)((long)pdVar2 + lVar10) = dVar15 * dVar15 + *(double *)((long)pdVar2 + lVar10);
          pdVar2 = (this->rHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(double *)((long)pdVar2 + lVar10) = dVar16 + *(double *)((long)pdVar2 + lVar10);
          piVar1 = (int *)((long)(this->count_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + (lVar14 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          sVar11 = sVar11 + 1;
          lVar14 = lVar14 + 0x100000000;
          lVar12 = lVar12 + 0x18;
        }
      }
      local_c8 = local_c8 + 0x18;
      sVar11 = __n;
    }
    uVar13 = uVar13 + 1;
  }
  std::operator<<((ostream *)&std::cout,"X, Y, R calculated\n");
  pdVar2 = (this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->yHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->rHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar12 = 0; (long)pdVar2 - (long)pdVar5 >> 3 != lVar12; lVar12 = lVar12 + 1) {
    dVar15 = (double)piVar3[lVar12];
    pdVar5[lVar12] = pdVar5[lVar12] / dVar15;
    pdVar6[lVar12] = pdVar6[lVar12] / dVar15;
    pdVar7[lVar12] = pdVar7[lVar12] / dVar15;
  }
  std::operator<<((ostream *)&std::cout,"X, Y, R normalized\n");
  return;
}

Assistant:

void SurfaceDiffusion::positionCorrelation() {
    RealType xDist = 0.0;
    RealType yDist = 0.0;
    RealType rDist = 0.0;
    int timeShift  = 0;
    Vector3d kPos;
    Vector3d jPos;
    // biggest timeShift is positions2_[0].size() - 1?
    xHist_.clear();
    yHist_.clear();
    rHist_.clear();
    count_.clear();
    int frameResize = positions2_[0].size();
    xHist_.resize(frameResize);
    yHist_.resize(frameResize);
    rHist_.resize(frameResize);
    count_.resize(frameResize);
    // loop over particles
    // loop over frames starting at j
    //  loop over frames starting at k = j (time shift of 0)
    for (std::size_t i = 0; i < positions2_.size(); i++) {
      int frames = positions2_[i].size() - 1;  // for counting
                                               // properly, otherwise
                                               // moBool2_[i][j+1] will
                                               // go over
      for (int j = 0; j < frames; j++) {
        // if the particle is mobile between j and j + 1, then count
        // it for all timeShifts
        if (moBool2_[i][j + 1]) {
          for (std::size_t k = j; k < positions2_[0].size(); k++) {
            //<x(t)-x(0)>  <y(t)-y(0)>  <r(t)-r(0)>
            // The positions stored are not wrapped, thus I don't need
            // to worry about pbc
            // Mean square displacement
            // So I do want the squared distances

            kPos  = positions2_[i][k];
            jPos  = positions2_[i][j];
            xDist = kPos.x() - jPos.x();
            xDist = xDist * xDist;

            yDist = kPos.y() - jPos.y();
            yDist = yDist * yDist;

            rDist = (kPos - jPos).lengthSquare();

            timeShift = k - j;
            xHist_[timeShift] += xDist;
            yHist_[timeShift] += yDist;
            rHist_[timeShift] += rDist;
            count_[timeShift]++;
          }
        }
      }
    }
    cout << "X, Y, R calculated\n";

    for (std::size_t i = 0; i < xHist_.size(); i++) {
      xHist_[i] = xHist_[i] / (count_[i]);
      yHist_[i] = yHist_[i] / (count_[i]);
      rHist_[i] = rHist_[i] / (count_[i]);
    }
    cout << "X, Y, R normalized\n";
  }